

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O3

void __thiscall avro::NodeMap::printJson(NodeMap *this,ostream *os,int depth)

{
  indent x;
  pointer psVar1;
  element_type *peVar2;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{\n",2);
  x.d = depth + 1;
  operator<<(os,x);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"type\": \"map\",\n",0xf);
  operator<<(os,x);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"values\": ",10);
  psVar1 = (this->super_NodeImplMap).leafAttributes_.attrs_.
           super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)((long)(this->super_NodeImplMap).leafAttributes_.attrs_.
                        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4)) {
    peVar2 = psVar1[1].px;
    (**(code **)((long)peVar2->_vptr_Node + 0x68))(peVar2,os,x.d);
    uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 6),1);
    operator<<(os,(indent)depth);
    uStack_28 = CONCAT17(0x7d,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 7),1);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
}

Assistant:

void 
NodeMap::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(depth+1) <<"\"type\": \"map\",\n";
    os << indent(depth+1) << "\"values\": ";
    leafAttributes_.get(1)->printJson(os, depth+1);
    os << '\n';
    os << indent(depth) << '}';
}